

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void __thiscall Z80::OpCode_POP(Z80 *this)

{
  long lVar1;
  bool bVar2;
  Z80Reg ZVar3;
  char **ppcVar4;
  long lVar5;
  Z80Reg regs [30];
  Z80Reg aZStack_90 [32];
  
  ppcVar4 = (char **)this;
  if (DAT_0018e509 == '\0') {
    do {
      aZStack_90[0] = 0x137ba9;
      aZStack_90[1] = Z80_B;
      ZVar3 = GetRegister(ppcVar4);
      aZStack_90[0] = 0x137bb0;
      aZStack_90[1] = Z80_B;
      OpCode_POPone(ZVar3);
      ppcVar4 = &lp;
      aZStack_90[0] = 0x137bb8;
      aZStack_90[1] = Z80_B;
      bVar2 = relaxedMaComma(&lp);
    } while (bVar2);
  }
  else {
    lVar1 = 2;
    do {
      lVar5 = lVar1;
      aZStack_90[0] = 0x137b5f;
      aZStack_90[1] = Z80_B;
      ZVar3 = GetRegister((char **)this);
      aZStack_90[lVar5] = ZVar3;
      aZStack_90[0] = 0x137b6b;
      aZStack_90[1] = Z80_B;
      ZVar3 = GetRegister_r16Low(ZVar3);
      if ((ZVar3 == Z80_UNK) || (lVar5 == 0x1f)) break;
      ppcVar4 = &lp;
      aZStack_90[0] = 0x137b7e;
      aZStack_90[1] = Z80_B;
      bVar2 = relaxedMaComma(&lp);
      lVar1 = lVar5 + 1;
      this = (Z80 *)ppcVar4;
    } while (bVar2);
    do {
      aZStack_90[0] = 0x137b92;
      aZStack_90[1] = Z80_B;
      OpCode_POPone(aZStack_90[(ulong)((int)lVar5 - 2) + 2]);
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  return;
}

Assistant:

static void OpCode_POP() {
		if (Options::syx.IsReversePOP) OpCode_POPreverse();
		else OpCode_POPnormal();
	}